

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O2

void Glucose_QuantifyAigTest(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  SimpSolver *pSVar4;
  SimpSolver *pSVar5;
  SimpSolver *pSat;
  abctime aVar6;
  Gia_Obj_t *pGVar7;
  abctime aVar8;
  abctime aVar9;
  abctime aVar10;
  int fHash;
  abctime time;
  abctime time_00;
  char *__s;
  bmcg_sat_solver *pSats [3];
  
  pSVar4 = glucose_solver_start();
  pSats[0] = pSVar4;
  pSVar5 = glucose_solver_start();
  pSats[1] = pSVar5;
  pSat = glucose_solver_start();
  pSats[2] = pSat;
  aVar6 = Abc_Clock();
  pGVar7 = Gia_ManPo(p,0);
  iVar1 = Gia_ObjFaninLit0p(p,pGVar7);
  iVar1 = bmcg_sat_solver_quantify(pSats,p,iVar1,0,Gia_ManCiIsToKeep,(void *)0x0,(Vec_Int_t *)0x0);
  aVar8 = Abc_Clock();
  aVar9 = Abc_Clock();
  pGVar7 = Gia_ManPo(p,0);
  iVar2 = Gia_ObjFaninLit0p(p,pGVar7);
  iVar2 = bmcg_sat_solver_quantify2(p,iVar2,fHash,Gia_ManCiIsToKeep,(void *)0x0,(Vec_Int_t *)0x0);
  aVar10 = Abc_Clock();
  Abc_PrintTime(0x80129d,(char *)(aVar8 - aVar6),time);
  Abc_PrintTime(0x85279a,(char *)(aVar10 - aVar9),time_00);
  iVar3 = bmcg_sat_solver_equiv_overlap_check(pSat,p,iVar1,iVar2,1);
  __s = "Verification passed.";
  if (iVar3 == 0) {
    __s = "Verification FAILED.";
  }
  puts(__s);
  Gia_ManAppendCo(p,iVar1);
  Gia_ManAppendCo(p,iVar2);
  (*(pSVar4->super_Solver)._vptr_Solver[1])();
  (*(pSVar5->super_Solver)._vptr_Solver[1])();
  (*(pSat->super_Solver)._vptr_Solver[1])(pSat);
  return;
}

Assistant:

void Glucose_QuantifyAigTest( Gia_Man_t * p )
{
    bmcg_sat_solver * pSats[3] = { bmcg_sat_solver_start(), bmcg_sat_solver_start(), bmcg_sat_solver_start() };

    abctime clk1 = Abc_Clock();
    int iRes1 = bmcg_sat_solver_quantify( pSats, p, Gia_ObjFaninLit0p(p, Gia_ManPo(p, 0)), 0, Gia_ManCiIsToKeep, NULL, NULL );
    abctime clk1d = Abc_Clock()-clk1;

    abctime clk2 = Abc_Clock();
    int iRes2 = bmcg_sat_solver_quantify2( p, Gia_ObjFaninLit0p(p, Gia_ManPo(p, 0)), 0, Gia_ManCiIsToKeep, NULL, NULL );
    abctime clk2d = Abc_Clock()-clk2;

    Abc_PrintTime( 1, "Time1", clk1d );
    Abc_PrintTime( 1, "Time2", clk2d );

    if ( bmcg_sat_solver_equiv_overlap_check( pSats[2], p, iRes1, iRes2, 1 ) )
        printf( "Verification passed.\n" );
    else
        printf( "Verification FAILED.\n" );

    Gia_ManAppendCo( p, iRes1 );
    Gia_ManAppendCo( p, iRes2 );

    bmcg_sat_solver_stop( pSats[0] );
    bmcg_sat_solver_stop( pSats[1] );
    bmcg_sat_solver_stop( pSats[2] );
}